

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_ftoa_rev.cc
# Opt level: O3

void require_ftoa_rev_bin(char *expected,npf_double_bin_t bin)

{
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,expected,&local_31);
  require_ftoa_rev(&local_30,(double)bin);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

static void require_ftoa_rev_bin(char const *expected, npf_double_bin_t bin) {
  double dbl;
  memcpy(&dbl, &bin, sizeof(dbl));
  require_ftoa_rev(expected, dbl);
}